

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_BitMap.cpp
# Opt level: O0

void anon_unknown.dwarf_762da::run(void)

{
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  IVar1;
  void *pvVar2;
  RbTreeNode<int,_int> *pRVar3;
  uint *puVar4;
  size_t i_1;
  size_t i;
  MapIteratorX<int,_int> it2;
  Iterator it;
  RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int> tree;
  Iterator<(anonymous_namespace)::Base,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Base,_axl::sl::ListLink>_>
  itBase;
  Iterator<(anonymous_namespace)::Derived,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Derived,_axl::sl::ListLink>_>
  itDerived;
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  in_stack_fffffffffffffee8;
  RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int> *in_stack_fffffffffffffef0;
  Iterator<(anonymous_namespace)::Derived,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Derived,_axl::sl::ListLink>_>
  *in_stack_fffffffffffffef8;
  Iterator<(anonymous_namespace)::Base,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Base,_axl::sl::ListLink>_>
  *in_stack_ffffffffffffff00;
  BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
  *in_stack_ffffffffffffff08;
  BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
  *this;
  ulong local_a0;
  ulong local_80;
  IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  local_50 [7];
  undefined8 local_18;
  undefined8 local_10;
  
  this = (BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
          *)&stack0xfffffffffffffff8;
  axl::sl::
  Iterator<(anonymous_namespace)::Derived,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Derived,_axl::sl::ListLink>_>
  ::Iterator((Iterator<(anonymous_namespace)::Derived,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Derived,_axl::sl::ListLink>_>
              *)0x125a89);
  axl::sl::
  Iterator<(anonymous_namespace)::Base,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Base,_axl::sl::ListLink>_>
  ::Iterator((Iterator<(anonymous_namespace)::Base,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Base,_axl::sl::ListLink>_>
              *)0x125a96);
  axl::sl::
  Iterator<(anonymous_namespace)::Base,axl::sl::ImplicitPtrCast<(anonymous_namespace)::Base,axl::sl::ListLink>>
  ::
  Iterator<(anonymous_namespace)::Derived,axl::sl::ImplicitPtrCast<(anonymous_namespace)::Derived,axl::sl::ListLink>>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_10 = local_18;
  axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>::RbTree
            (in_stack_fffffffffffffef0,(Cmp<int,_int> *)in_stack_fffffffffffffee8.m_p);
  axl::sl::
  Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  ::Iterator((Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
              *)0x125ada);
  IVar1.m_p = (Entry *)axl::sl::
                       BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
                       ::find(in_stack_ffffffffffffff08,
                              (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  (anonymous_namespace)::MapIteratorX<int,int>::MapIteratorX<axl::sl::RbTreeNode<int,int>>
            ((MapIteratorX<int,_int> *)in_stack_fffffffffffffef0,
             (Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
              *)in_stack_fffffffffffffee8.m_p);
  (anonymous_namespace)::MapIteratorX<int,int>::MapIteratorX<axl::sl::RbTreeNode<int,int>>
            ((MapIteratorX<int,_int> *)in_stack_fffffffffffffef0,
             (Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
              *)in_stack_fffffffffffffee8.m_p);
  for (local_80 = 0; local_80 < 0x32; local_80 = local_80 + 1) {
    rand();
    axl::sl::
    BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
    ::visit(this,(int)((ulong)IVar1.m_p >> 0x20));
  }
  local_50[0].
  super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  .m_p = (IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
          )axl::sl::
           BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
           ::getHead((BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
                      *)in_stack_fffffffffffffee8.m_p);
  while( true ) {
    pvVar2 = axl::sl::IteratorBase::operator_cast_to_void_((IteratorBase *)local_50);
    if (pvVar2 == (void *)0x0) break;
    pRVar3 = axl::sl::
             IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
             ::operator->(local_50);
    puVar4 = (uint *)axl::sl::MapEntry<int,_int>::getKey((MapEntry<int,_int> *)pRVar3);
    printf("%d\n",(ulong)*puVar4);
    axl::sl::
    IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
    ::operator++((IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
                  *)in_stack_fffffffffffffee8.m_p,0);
  }
  printf(".........\n");
  for (local_a0 = 0; local_a0 < 0x32; local_a0 = local_a0 + 1) {
    rand();
    axl::sl::
    BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
    ::eraseKey(in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  }
  local_50[0].
  super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  .m_p = (IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
          )axl::sl::
           BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
           ::getHead((BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
                      *)in_stack_fffffffffffffee8.m_p);
  while( true ) {
    pvVar2 = axl::sl::IteratorBase::operator_cast_to_void_((IteratorBase *)local_50);
    if (pvVar2 == (void *)0x0) break;
    pRVar3 = axl::sl::
             IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
             ::operator->(local_50);
    puVar4 = (uint *)axl::sl::MapEntry<int,_int>::getKey((MapEntry<int,_int> *)pRVar3);
    printf("%d\n",(ulong)*puVar4);
    in_stack_fffffffffffffee8.m_p =
         (Entry *)axl::sl::
                  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
                  ::operator++(in_stack_fffffffffffffee8.m_p,0);
  }
  printf(".........\n");
  axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>::~RbTree
            ((RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int> *)0x125dbb);
  return;
}

Assistant:

void run() {
	static size_t ranges[][2] = {
		{ 0,   0 },
		{ 0,   1 },
		{ 0,   2 },
		{ 0,   16 },
		{ 0,   32 },
		{ 0,   64 },
		{ 0,   128 },
		{ 0,   16 - 1 },
		{ 0,   32 - 1 },
		{ 0,   64 - 1 },
		{ 0,   128 - 1 },
		{ 0,   16 - 2 },
		{ 0,   32 - 2 },
		{ 0,   64 - 2 },
		{ 0,   128 - 2 },
		{ 0,   16 + 1 },
		{ 0,   32 + 1 },
		{ 0,   64 + 1 },
		{ 0,   128 + 1 },

		{ 128,  128 },
		{ 128,  128 + 1 },
		{ 128,  128 + 2 },
		{ 128,  128 + 16 },
		{ 128,  128 + 32 },
		{ 128,  128 + 64 },
		{ 128,  128 + 128 },
		{ 128,  128 + 16 - 1 },
		{ 128,  128 + 32 - 1 },
		{ 128,  128 + 64 - 1 },
		{ 128,  128 + 128 - 1 },
		{ 128,  128 + 16 - 2 },
		{ 128,  128 + 32 - 2 },
		{ 128,  128 + 64 - 2 },
		{ 128,  128 + 128 - 2 },
		{ 128,  128 + 16 + 1 },
		{ 128,  128 + 32 + 1 },
		{ 128,  128 + 64 + 1 },
		{ 128,  128 + 128 + 1 },

		{ 128 - 1,  128 - 1 },
		{ 128 - 1,  128 + 1 },
		{ 128 - 1,  128 + 2 },
		{ 128 - 1,  128 + 16 },
		{ 128 - 1,  128 + 32 },
		{ 128 - 1,  128 + 64 },
		{ 128 - 1,  128 + 128 },
		{ 128 - 1,  128 + 16 - 1 },
		{ 128 - 1,  128 + 32 - 1 },
		{ 128 - 1,  128 + 64 - 1 },
		{ 128 - 1,  128 + 128 - 1 },
		{ 128 - 1,  128 + 16 - 2 },
		{ 128 - 1,  128 + 32 - 2 },
		{ 128 - 1,  128 + 64 - 2 },
		{ 128 - 1,  128 + 128 - 2 },
		{ 128 - 1,  128 + 16 + 1 },
		{ 128 - 1,  128 + 32 + 1 },
		{ 128 - 1,  128 + 64 + 1 },
		{ 128 - 1,  128 + 128 + 1 },

		{ 128 - 2,  128 - 2 },
		{ 128 - 2,  128 + 1 },
		{ 128 - 2,  128 + 2 },
		{ 128 - 2,  128 + 16 },
		{ 128 - 2,  128 + 32 },
		{ 128 - 2,  128 + 64 },
		{ 128 - 2,  128 + 128 },
		{ 128 - 2,  128 + 16 - 1 },
		{ 128 - 2,  128 + 32 - 1 },
		{ 128 - 2,  128 + 64 - 1 },
		{ 128 - 2,  128 + 128 - 1 },
		{ 128 - 2,  128 + 16 - 2 },
		{ 128 - 2,  128 + 32 - 2 },
		{ 128 - 2,  128 + 64 - 2 },
		{ 128 - 2,  128 + 128 - 2 },
		{ 128 - 2,  128 + 16 + 1 },
		{ 128 - 2,  128 + 32 + 1 },
		{ 128 - 2,  128 + 64 + 1 },
		{ 128 - 2,  128 + 128 + 1 },

		{ 128 + 1,  128 + 1 },
		{ 128 + 1,  128 + 2 },
		{ 128 + 1,  128 + 16 },
		{ 128 + 1,  128 + 32 },
		{ 128 + 1,  128 + 64 },
		{ 128 + 1,  128 + 128 },
		{ 128 + 1,  128 + 16 - 1 },
		{ 128 + 1,  128 + 32 - 1 },
		{ 128 + 1,  128 + 64 - 1 },
		{ 128 + 1,  128 + 128 - 1 },
		{ 128 + 1,  128 + 16 - 2 },
		{ 128 + 1,  128 + 32 - 2 },
		{ 128 + 1,  128 + 64 - 2 },
		{ 128 + 1,  128 + 128 - 2 },
		{ 128 + 1,  128 + 16 + 1 },
		{ 128 + 1,  128 + 32 + 1 },
		{ 128 + 1,  128 + 64 + 1 },
		{ 128 + 1,  128 + 128 + 1 },

		{ 1,              1 },
		{ 1,              512 },
		{ 2,              512 },
		{ 16,             512 },
		{ 32,             512 },
		{ 64,             512 },
		{ 128,            512 },
		{ 16 - 1,         512 },
		{ 32 - 1,         512 },
		{ 64 - 1,         512 },
		{ 128 - 1,        512 },
		{ 16 - 2,         512 },
		{ 32 - 2,         512 },
		{ 64 - 2,         512 },
		{ 128 - 2,        512 },
		{ 16 + 1,         512 },
		{ 32 + 1,         512 },
		{ 64 + 1,         512 },
		{ 128 + 1,        512 },

		{ 128 + 1,        512 - 1 },
		{ 128 + 2,        512 - 1 },
		{ 128 + 16,       512 - 1 },
		{ 128 + 32,       512 - 1 },
		{ 128 + 64,       512 - 1 },
		{ 128 + 128,      512 - 1 },
		{ 128 + 16 - 1,   512 - 1 },
		{ 128 + 32 - 1,   512 - 1 },
		{ 128 + 64 - 1,   512 - 1 },
		{ 128 + 128 - 1,  512 - 1 },
		{ 128 + 16 - 2,   512 - 1 },
		{ 128 + 32 - 2,   512 - 1 },
		{ 128 + 64 - 2,   512 - 1 },
		{ 128 + 128 - 2,  512 - 1 },
		{ 128 + 16 + 1,   512 - 1 },
		{ 128 + 32 + 1,   512 - 1 },
		{ 128 + 64 + 1,   512 - 1 },
		{ 128 + 128 + 1,  512 - 1 },

		{ 128 + 1,        512 - 2 },
		{ 128 + 2,        512 - 2 },
		{ 128 + 16,       512 - 2 },
		{ 128 + 32,       512 - 2 },
		{ 128 + 64,       512 - 2 },
		{ 128 + 128,      512 - 2 },
		{ 128 + 16 - 1,   512 - 2 },
		{ 128 + 32 - 1,   512 - 2 },
		{ 128 + 64 - 1,   512 - 2 },
		{ 128 + 128 - 1,  512 - 2 },
		{ 128 + 16 - 2,   512 - 2 },
		{ 128 + 32 - 2,   512 - 2 },
		{ 128 + 64 - 2,   512 - 2 },
		{ 128 + 128 - 2,  512 - 2 },
		{ 128 + 16 + 1,   512 - 2 },
		{ 128 + 32 + 1,   512 - 2 },
		{ 128 + 64 + 1,   512 - 2 },
		{ 128 + 128 + 1,  512 - 2 },
	};

	static size_t shifts[] = {
		0,
		1,
		2,

		16,
		32,
		64,
		128,

		16 - 1,
		32 - 1,
		64 - 1,
		128 - 1,

		16 - 2,
		32 - 2,
		64 - 2,
		128 - 2,

		16 + 1,
		32 + 1,
		64 + 1,
		128 + 1,
	};

	enum {
		Overshoot = 128
	};

	for (size_t i = 0; i < countof(ranges); i++) {
		size_t from = ranges[i][0];
		size_t to = ranges[i][1];
		ASSERT(from <= to);

		printf("from: %d to %d\n", from, to);

		sl::BitMap bitMap;
		bitMap.setBitRangeResize(from, to);

		sl::BitMap bitMapInv;
		bitMapInv.ensureBitCount(to + Overshoot + 1);
		bitMapInv.invert();
		bitMapInv.clearBitRange(from, to);

		for (size_t j = 0; j < to + Overshoot; j++) {
			bool b = bitMap.getBit(j);
			bool b2 = bitMapInv.getBit(j);
			TEST_ASSERT(b == !b2);

			bool isInside = j >= from && j < to;
			TEST_ASSERT(b && isInside || !b && !isInside);
		}

		if (from >= to) {
			TEST_ASSERT(bitMap.findBit() == -1);
			TEST_ASSERT(bitMap.findBitReverse() == -1);
			TEST_ASSERT(bitMapInv.findZeroBit() == -1);
			TEST_ASSERT(bitMapInv.findZeroBitReverse() == -1);
		} else  {
			TEST_ASSERT(bitMap.findBit() == from);
			TEST_ASSERT(bitMap.findBitReverse() == to - 1);
			TEST_ASSERT(bitMapInv.findZeroBit() == from);
			TEST_ASSERT(bitMapInv.findZeroBitReverse() == to - 1);
		}

		printf("  SHR\n");
		for (size_t l = 0; l < countof(shifts); l++) {
			size_t shift = shifts[l];
			printf("    >> %d\n", shift);

			from = ranges[i][0];
			to = ranges[i][1];
			from = from > shift ? from - shift : 0;
			to = to > shift ? to - shift : 0;

			sl::BitMap bitMapShr = bitMap;
			bitMapShr.shr(shift);

			for (size_t j = 0; j < to + Overshoot; j++) {
				bool b = bitMapShr.getBit(j);
				bool isInside = j >= from && j < to;
				TEST_ASSERT(b && isInside || !b && !isInside);
			}

			if (from >= to || to == 0) { // all shifted out
				TEST_ASSERT(bitMapShr.findBit() == -1);
				TEST_ASSERT(bitMapShr.findBitReverse() == - 1);
			} else {
				TEST_ASSERT(bitMapShr.findBit() == from);
				TEST_ASSERT(bitMapShr.findBitReverse() == to - 1);
			}
		}

		printf("  SHL\n");
		for (size_t l = 0; l < countof(shifts); l++) {
			size_t shift = shifts[l];
			printf("    << %d\n", shift);

			from = ranges[i][0] + shift;
			to = ranges[i][1] + shift;

			sl::BitMap bitMapShl = bitMap;
			bitMapShl.shlResize(shift);

			for (size_t j = 0; j < to + Overshoot; j++) {
				bool b = bitMapShl.getBit(j);
				bool isInside = j >= from && j < to;
				ASSERT(b && isInside || !b && !isInside);
			}

			if (from >= to) {
				TEST_ASSERT(bitMapShl.findBit() == -1);
				TEST_ASSERT(bitMapShl.findBitReverse() == -1);
			} else {
				TEST_ASSERT(bitMapShl.findBit() == from);
				TEST_ASSERT(bitMapShl.findBitReverse() == to - 1);
			}
		}
	}
}